

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gil.h
# Opt level: O0

void __thiscall pybind11::gil_scoped_acquire::dec_ref(gil_scoped_acquire *this)

{
  PyThreadState *pPVar1;
  internals *piVar2;
  long *in_RDI;
  char *unaff_retaddr;
  
  *(int *)(*in_RDI + 0xa0) = *(int *)(*in_RDI + 0xa0) + -1;
  pPVar1 = detail::get_thread_state_unchecked();
  if (pPVar1 != (PyThreadState *)*in_RDI) {
    pybind11_fail(unaff_retaddr);
  }
  if (*(int *)(*in_RDI + 0xa0) < 0) {
    pybind11_fail(unaff_retaddr);
  }
  if (*(int *)(*in_RDI + 0xa0) == 0) {
    if ((*(byte *)(in_RDI + 1) & 1) == 0) {
      pybind11_fail(unaff_retaddr);
    }
    PyThreadState_Clear(*in_RDI);
    if ((*(byte *)((long)in_RDI + 9) & 1) != 0) {
      PyThreadState_DeleteCurrent();
    }
    piVar2 = detail::get_internals();
    PyThread_tss_set(piVar2->tstate,0);
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  return;
}

Assistant:

PYBIND11_NOINLINE void dec_ref() {
        --tstate->gilstate_counter;
        #if !defined(NDEBUG)
            if (detail::get_thread_state_unchecked() != tstate)
                pybind11_fail("scoped_acquire::dec_ref(): thread state must be current!");
            if (tstate->gilstate_counter < 0)
                pybind11_fail("scoped_acquire::dec_ref(): reference count underflow!");
        #endif
        if (tstate->gilstate_counter == 0) {
            #if !defined(NDEBUG)
                if (!release)
                    pybind11_fail("scoped_acquire::dec_ref(): internal error!");
            #endif
            PyThreadState_Clear(tstate);
            if (active)
                PyThreadState_DeleteCurrent();
            PYBIND11_TLS_DELETE_VALUE(detail::get_internals().tstate);
            release = false;
        }
    }